

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_switch_deviation(lys_deviation *dev,lys_module *module)

{
  lys_node *plVar1;
  ly_ctx *plVar2;
  char *pcVar3;
  LY_ERR *pLVar4;
  lys_node *parent;
  lys_node *target;
  char *parent_path;
  lys_module *plStack_18;
  int ret;
  lys_module *module_local;
  lys_deviation *dev_local;
  
  parent = (lys_node *)0x0;
  if (dev->deviate != (lys_deviate *)0x0) {
    plStack_18 = module;
    module_local = (lys_module *)dev;
    if (dev->deviate->mod == LY_DEVIATE_NO) {
      if (dev->orig_node == (lys_node *)0x0) {
        parent_path._4_4_ =
             resolve_augment_schema_nodeid(dev->target_name,(lys_node *)0x0,module,1,&parent);
        if ((parent_path._4_4_ == 0) && (parent != (lys_node *)0x0)) {
          plVar1 = parent->parent;
          lys_node_unlink(parent);
          if ((plVar1 != (lys_node *)0x0) && (plVar1->nodetype == LYS_AUGMENT)) {
            parent->parent = plVar1;
          }
          module_local->dsc = (char *)parent;
        }
        else {
          pLVar4 = ly_errno_location();
          *pLVar4 = LY_EINT;
          ly_log(LY_LLERR,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                 ,0x1032);
        }
      }
      else {
        plVar2 = (ly_ctx *)strrchr(dev->target_name,0x2f);
        if (plVar2 == module_local->ctx) {
          lys_node_addchild((lys_node *)0x0,*(lys_module **)(module_local->dsc + 0x30),
                            (lys_node *)module_local->dsc);
        }
        else {
          plVar1 = *(lys_node **)(module_local->dsc + 0x40);
          if (plVar1 == (lys_node *)0x0) {
            plVar2 = module_local->ctx;
            pcVar3 = strrchr((char *)module_local->ctx,0x2f);
            target = (lys_node *)strndup((char *)plVar2,(long)pcVar3 - (long)module_local->ctx);
            parent_path._4_4_ =
                 resolve_augment_schema_nodeid((char *)target,(lys_node *)0x0,plStack_18,1,&parent);
            free(target);
            if ((parent_path._4_4_ != 0) || (parent == (lys_node *)0x0)) {
              pLVar4 = ly_errno_location();
              *pLVar4 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                     ,0x1022);
              return;
            }
            lys_node_addchild(parent,(lys_module *)0x0,(lys_node *)module_local->dsc);
          }
          else {
            lys_node_addchild(plVar1,(lys_module *)0x0,(lys_node *)module_local->dsc);
            if ((((byte)plVar1->module->field_0x40 >> 6 & 1) == 0) &&
               ((char)plVar1->module->field_0x40 < '\0')) {
              if (plVar1->child == (lys_node *)module_local->dsc) {
                *(ushort *)(module_local->dsc + 0x18) = *(ushort *)(module_local->dsc + 0x18) | 1;
                apply_aug((lys_node_augment *)plVar1);
              }
              else {
                *(ushort *)(module_local->dsc + 0x18) =
                     *(ushort *)(module_local->dsc + 0x18) | plVar1->child->flags & 1;
              }
            }
            else {
              *(ushort *)(module_local->dsc + 0x18) = *(ushort *)(module_local->dsc + 0x18) | 1;
            }
          }
        }
        module_local->dsc = (char *)0x0;
      }
    }
    else {
      parent_path._4_4_ =
           resolve_augment_schema_nodeid(dev->target_name,(lys_node *)0x0,module,1,&parent);
      if ((parent_path._4_4_ == 0) && (parent != (lys_node *)0x0)) {
        lys_node_switch(parent,(lys_node *)module_local->dsc);
        module_local->dsc = (char *)parent;
      }
      else {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
               ,0x1045);
      }
    }
  }
  return;
}

Assistant:

static void
lys_switch_deviation(struct lys_deviation *dev, const struct lys_module *module)
{
    int ret;
    char *parent_path;
    struct lys_node *target = NULL, *parent;

    if (!dev->deviate) {
        return ;
    }

    if (dev->deviate[0].mod == LY_DEVIATE_NO) {
        if (dev->orig_node) {
            /* removing not-supported deviation ... */
            if (strrchr(dev->target_name, '/') != dev->target_name) {
                /* ... from a parent */

                /* reconnect to its previous position */
                parent = dev->orig_node->parent;
                if (parent) {
                    /* the original node was actually from augment, we have to get know if the augment is
                     * applied (its module is enabled and implemented). If yes, the node will be connected
                     * to the augment and the linkage with the target will be fixed if needed, otherwise
                     * it will be connected only to the augment */
                    /* first, connect it into the augment */
                    lys_node_addchild(parent, NULL, dev->orig_node);
                    if (!parent->module->disabled && parent->module->implemented) {
                        /* augment is supposed to be applied, so fix pointers in target and the status of the original node */
                        if (parent->child == dev->orig_node) {
                            /* the only node in augment */
                            dev->orig_node->flags |= LYS_NOTAPPLIED;
                            apply_aug((struct lys_node_augment *)parent);
                        } else {
                            /* other nodes from augment applied, nothing more needed in target, everything was done
                             * by lys_node_addchild() */
                            dev->orig_node->flags |= parent->child->flags & LYS_NOTAPPLIED;
                        }
                    } else {
                        /* augment is not supposed to be applied */
                        dev->orig_node->flags |= LYS_NOTAPPLIED;
                    }
                } else {
                    /* non-augment, non-toplevel */
                    parent_path = strndup(dev->target_name, strrchr(dev->target_name, '/') - dev->target_name);
                    ret = resolve_augment_schema_nodeid(parent_path, NULL, module, 1,
                                                        (const struct lys_node **)&target);
                    free(parent_path);
                    if (ret || !target) {
                        LOGINT;
                        return;
                    }
                    lys_node_addchild(target, NULL, dev->orig_node);
                }
            } else {
                /* ... from top-level data */
                lys_node_addchild(NULL, (struct lys_module *)dev->orig_node->module, dev->orig_node);
            }

            dev->orig_node = NULL;
        } else {
            /* adding not-supported deviation */
            ret = resolve_augment_schema_nodeid(dev->target_name, NULL, module, 1,
                                                (const struct lys_node **)&target);
            if (ret || !target) {
                LOGINT;
                return;
            }

            /* unlink and store the original node */
            parent = target->parent;
            lys_node_unlink(target);
            if (parent && parent->nodetype == LYS_AUGMENT) {
                /* hack for augment, because when the original will be sometime reconnected back, we actually need
                 * to reconnect it to both - the augment and its target (which is deduced from the deviations target
                 * path), so we need to remember the augment as an addition */
                target->parent = parent;
            }
            dev->orig_node = target;
        }
    } else {
        ret = resolve_augment_schema_nodeid(dev->target_name, NULL, module, 1,
                                            (const struct lys_node **)&target);
        if (ret || !target) {
            LOGINT;
            return;
        }

        lys_node_switch(target, dev->orig_node);
        dev->orig_node = target;
    }
}